

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_opt.cpp
# Opt level: O3

void get_msurf_descriptor_precompute_gauss_case(integral_image *iimage,interest_point *ipoint)

{
  float *pfVar1;
  bool bVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  int col;
  int row;
  int iVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int scale;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  undefined1 auVar50 [64];
  undefined1 auVar54 [64];
  float fVar55;
  float gauss_s2;
  uint local_a4;
  float local_a0;
  float local_9c;
  long local_98;
  ulong local_90;
  interest_point *local_88;
  ulong local_80;
  float local_74;
  float local_70;
  uint local_6c;
  uint local_68;
  float local_64;
  ulong local_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  auVar48._8_4_ = 0x3effffff;
  auVar48._0_8_ = 0x3effffff3effffff;
  auVar48._12_4_ = 0x3effffff;
  auVar29._8_4_ = 0x80000000;
  auVar29._0_8_ = 0x8000000080000000;
  auVar29._12_4_ = 0x80000000;
  fVar46 = ipoint->scale;
  local_58 = ZEXT416((uint)fVar46);
  auVar18 = vpternlogd_avx512vl(auVar48,local_58,auVar29,0xf8);
  auVar18 = ZEXT416((uint)(fVar46 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  scale = (int)auVar18._0_4_;
  fVar55 = -0.08 / (fVar46 * fVar46);
  auVar18 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->x),auVar29,0xf8);
  auVar21._0_8_ = (double)fVar46;
  auVar21._8_8_ = 0;
  auVar18 = ZEXT416((uint)(ipoint->x + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar19._0_8_ = (double)auVar18._0_4_;
  auVar19._8_8_ = auVar18._8_8_;
  auVar18 = vfmadd231sd_fma(auVar19,auVar21,ZEXT816(0x3fe0000000000000));
  local_64 = (float)auVar18._0_8_;
  auVar18 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)ipoint->y),auVar29,0xf8);
  auVar18 = ZEXT416((uint)(ipoint->y + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar20._0_8_ = (double)auVar18._0_4_;
  auVar20._8_8_ = auVar18._8_8_;
  auVar18 = vfmadd231sd_fma(auVar20,auVar21,ZEXT816(0x3fe0000000000000));
  local_70 = (float)auVar18._0_8_;
  auVar18 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 0.5)),auVar29,0xf8);
  auVar18 = ZEXT416((uint)(fVar46 * 0.5 + auVar18._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  auVar19 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 1.5)),auVar29,0xf8);
  auVar19 = ZEXT416((uint)(fVar46 * 1.5 + auVar19._0_4_));
  auVar19 = vroundss_avx(auVar19,auVar19,0xb);
  auVar20 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 2.5)),auVar29,0xf8);
  auVar20 = ZEXT416((uint)(fVar46 * 2.5 + auVar20._0_4_));
  auVar20 = vroundss_avx(auVar20,auVar20,0xb);
  auVar21 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 3.5)),auVar29,0xf8);
  auVar21 = ZEXT416((uint)(fVar46 * 3.5 + auVar21._0_4_));
  auVar21 = vroundss_avx(auVar21,auVar21,0xb);
  auVar22 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 4.5)),auVar29,0xf8);
  auVar22 = ZEXT416((uint)(fVar46 * 4.5 + auVar22._0_4_));
  auVar22 = vroundss_avx(auVar22,auVar22,0xb);
  auVar23 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 5.5)),auVar29,0xf8);
  auVar23 = ZEXT416((uint)(auVar23._0_4_ + fVar46 * 5.5));
  auVar23 = vroundss_avx(auVar23,auVar23,0xb);
  auVar24 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 6.5)),auVar29,0xf8);
  auVar24 = ZEXT416((uint)(fVar46 * 6.5 + auVar24._0_4_));
  auVar24 = vroundss_avx(auVar24,auVar24,0xb);
  auVar54 = ZEXT1664(auVar24);
  auVar25 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 7.5)),auVar29,0xf8);
  auVar25 = ZEXT416((uint)(fVar46 * 7.5 + auVar25._0_4_));
  auVar25 = vroundss_avx(auVar25,auVar25,0xb);
  auVar26 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 8.5)),auVar29,0xf8);
  auVar26 = ZEXT416((uint)(fVar46 * 8.5 + auVar26._0_4_));
  auVar26 = vroundss_avx(auVar26,auVar26,0xb);
  auVar27 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 9.5)),auVar29,0xf8);
  auVar27 = ZEXT416((uint)(fVar46 * 9.5 + auVar27._0_4_));
  auVar27 = vroundss_avx(auVar27,auVar27,0xb);
  auVar28 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 10.5)),auVar29,0xf8);
  auVar28 = ZEXT416((uint)(fVar46 * 10.5 + auVar28._0_4_));
  auVar28 = vroundss_avx(auVar28,auVar28,0xb);
  auVar29 = vpternlogd_avx512vl(auVar48,ZEXT416((uint)(fVar46 * 11.5)),auVar29,0xf8);
  fVar43 = auVar20._0_4_;
  fVar31 = fVar43 + auVar18._0_4_;
  fVar30 = fVar43 + auVar19._0_4_;
  fVar32 = fVar43 - auVar18._0_4_;
  fVar33 = fVar43 - auVar19._0_4_;
  fVar34 = fVar43 - auVar21._0_4_;
  auVar18 = ZEXT416((uint)(fVar46 * 11.5 + auVar29._0_4_));
  auVar18 = vroundss_avx(auVar18,auVar18,0xb);
  fVar46 = fVar43 - auVar23._0_4_;
  fVar35 = fVar43 - auVar22._0_4_;
  fVar44 = auVar25._0_4_;
  fVar45 = fVar44 - auVar18._0_4_;
  fVar38 = fVar44 - auVar21._0_4_;
  fVar39 = fVar44 - auVar22._0_4_;
  fVar40 = fVar44 - auVar23._0_4_;
  fVar41 = fVar44 - auVar24._0_4_;
  local_80 = CONCAT44(local_80._4_4_,fVar43 - auVar24._0_4_);
  fVar43 = fVar44 - auVar27._0_4_;
  local_90 = CONCAT44(local_90._4_4_,fVar44 - auVar26._0_4_);
  fVar44 = fVar44 - auVar28._0_4_;
  local_88 = ipoint;
  fVar30 = expf(fVar55 * fVar30 * fVar30);
  fVar31 = expf(fVar31 * fVar31 * fVar55);
  fVar32 = expf(fVar32 * fVar32 * fVar55);
  fVar33 = expf(fVar33 * fVar33 * fVar55);
  fVar34 = expf(fVar34 * fVar34 * fVar55);
  fVar35 = expf(fVar35 * fVar35 * fVar55);
  fVar36 = expf(fVar46 * fVar46 * fVar55);
  fVar37 = expf((float)local_80 * (float)local_80 * fVar55);
  fVar38 = expf(fVar38 * fVar38 * fVar55);
  fVar39 = expf(fVar39 * fVar39 * fVar55);
  fVar40 = expf(fVar40 * fVar40 * fVar55);
  fVar41 = expf(fVar41 * fVar41 * fVar55);
  fVar42 = expf((float)local_90 * (float)local_90 * fVar55);
  fVar43 = expf(fVar43 * fVar43 * fVar55);
  fVar44 = expf(fVar44 * fVar44 * fVar55);
  fVar45 = expf(fVar45 * fVar45 * fVar55);
  local_90 = (ulong)(uint)(scale * 2);
  fVar46 = 0.0;
  uVar13 = 0;
  local_a4 = 4;
  iVar6 = 0;
  local_98 = 0;
  iVar16 = -8;
  do {
    uVar10 = 0xfffffff8;
    local_98 = (long)(int)local_98;
    local_6c = uVar13;
    do {
      iVar11 = (int)uVar10 + -4;
      auVar50 = ZEXT1664(ZEXT816(0) << 0x40);
      uVar14 = 0xfffffffc;
      local_74 = fVar46;
      local_68 = uVar13;
      local_60 = uVar10;
      do {
        iVar8 = (int)local_60;
        uVar3 = (undefined4)uVar14;
        if (iVar8 < 2) {
          if (iVar8 == -8) {
            fVar46 = -1.0;
            switch(uVar3) {
            case 0:
switchD_00190cc6_caseD_0:
              fVar46 = 1.0;
              break;
            case 1:
switchD_00190d26_caseD_1:
              fVar46 = fVar41;
              break;
            case 2:
switchD_00190d26_caseD_2:
              fVar46 = fVar40;
              break;
            case 3:
switchD_00190d26_caseD_3:
              fVar46 = fVar39;
              break;
            case 4:
switchD_00190d26_caseD_4:
              fVar46 = fVar38;
              break;
            case 0xfffffffc:
switchD_00190d26_caseD_fffffffc:
              fVar46 = fVar45;
              break;
            case 0xfffffffd:
switchD_00190d26_caseD_fffffffd:
              fVar46 = fVar44;
              break;
            case 0xfffffffe:
switchD_00190d26_caseD_fffffffe:
              fVar46 = fVar43;
              break;
            case 0xffffffff:
switchD_00190d26_caseD_ffffffff:
              fVar46 = fVar42;
            }
          }
          else {
            fVar46 = -1.0;
            if (iVar8 == -3) {
              fVar46 = -1.0;
              switch(uVar3) {
              case 0:
                goto switchD_00190cc6_caseD_0;
              case 1:
                goto switchD_00190cc6_caseD_1;
              case 2:
                goto switchD_00190cc6_caseD_2;
              case 3:
                goto switchD_00190cc6_caseD_3;
              case 4:
                goto switchD_00190cc6_caseD_4;
              case 0xfffffffc:
                goto switchD_00190cc6_caseD_fffffffc;
              case 0xfffffffd:
                goto switchD_00190cc6_caseD_fffffffd;
              case 0xfffffffe:
                goto switchD_00190cc6_caseD_fffffffe;
              case 0xffffffff:
                goto switchD_00190cc6_caseD_ffffffff;
              }
            }
          }
        }
        else if (iVar8 == 2) {
          fVar46 = -1.0;
          switch(uVar3) {
          case 0:
            goto switchD_00190cc6_caseD_0;
          case 1:
switchD_00190cc6_caseD_ffffffff:
            fVar46 = fVar34;
            break;
          case 2:
switchD_00190cc6_caseD_fffffffe:
            fVar46 = fVar35;
            break;
          case 3:
switchD_00190cc6_caseD_fffffffd:
            fVar46 = fVar36;
            break;
          case 4:
switchD_00190cc6_caseD_fffffffc:
            fVar46 = fVar37;
            break;
          case 0xfffffffc:
switchD_00190cc6_caseD_4:
            fVar46 = fVar30;
            break;
          case 0xfffffffd:
switchD_00190cc6_caseD_3:
            fVar46 = fVar31;
            break;
          case 0xfffffffe:
switchD_00190cc6_caseD_2:
            fVar46 = fVar32;
            break;
          case 0xffffffff:
switchD_00190cc6_caseD_1:
            fVar46 = fVar33;
          }
        }
        else {
          fVar46 = -1.0;
          if (iVar8 == 7) {
            fVar46 = -1.0;
            switch(uVar3) {
            case 0:
              goto switchD_00190cc6_caseD_0;
            case 1:
              goto switchD_00190d26_caseD_ffffffff;
            case 2:
              goto switchD_00190d26_caseD_fffffffe;
            case 3:
              goto switchD_00190d26_caseD_fffffffd;
            case 4:
              goto switchD_00190d26_caseD_fffffffc;
            case 0xfffffffc:
              goto switchD_00190d26_caseD_4;
            case 0xfffffffd:
              goto switchD_00190d26_caseD_3;
            case 0xfffffffe:
              goto switchD_00190d26_caseD_2;
            case 0xffffffff:
              goto switchD_00190d26_caseD_1;
            }
          }
        }
        auVar18._0_4_ = (float)iVar11;
        auVar18._4_12_ = auVar54._4_12_;
        iVar17 = -0xc;
        auVar18 = vfmadd132ss_fma(auVar18,ZEXT416((uint)local_70),ZEXT416((uint)local_58._0_4_));
        auVar23._8_4_ = 0x3effffff;
        auVar23._0_8_ = 0x3effffff3effffff;
        auVar23._12_4_ = 0x3effffff;
        auVar22._8_4_ = 0x80000000;
        auVar22._0_8_ = 0x8000000080000000;
        auVar22._12_4_ = 0x80000000;
        auVar19 = vpternlogd_avx512vl(auVar23,auVar18,auVar22,0xf8);
        auVar18 = ZEXT416((uint)(auVar18._0_4_ + auVar19._0_4_));
        auVar18 = vroundss_avx(auVar18,auVar18,0xb);
        row = (int)auVar18._0_4_ - scale;
        iVar8 = (int)local_90;
        local_80 = uVar14;
        do {
          if (iVar16 < 2) {
            if (iVar16 == -8) {
              fVar55 = -1.0;
              switch(iVar17) {
              case -0xc:
switchD_00190ef4_caseD_fffffff4:
                fVar55 = fVar45;
                break;
              case -0xb:
switchD_00190ef4_caseD_fffffff5:
                fVar55 = fVar44;
                break;
              case -10:
switchD_00190ef4_caseD_fffffff6:
                fVar55 = fVar43;
                break;
              case -9:
switchD_00190ef4_caseD_fffffff7:
                fVar55 = fVar42;
                break;
              case -8:
switchD_00190e94_caseD_fffffff8:
                fVar55 = 1.0;
                break;
              case -7:
switchD_00190ef4_caseD_fffffff9:
                fVar55 = fVar41;
                break;
              case -6:
switchD_00190ef4_caseD_fffffffa:
                fVar55 = fVar40;
                break;
              case -5:
switchD_00190ef4_caseD_fffffffb:
                fVar55 = fVar39;
                break;
              case -4:
switchD_00190ef4_caseD_fffffffc:
                fVar55 = fVar38;
              }
            }
            else {
              fVar55 = -1.0;
              if (iVar16 == -3) {
                fVar55 = -1.0;
                switch(iVar17) {
                case -0xc:
                  goto switchD_00190e94_caseD_fffffff4;
                case -0xb:
                  goto switchD_00190e94_caseD_fffffff5;
                case -10:
                  goto switchD_00190e94_caseD_fffffff6;
                case -9:
                  goto switchD_00190e94_caseD_fffffff7;
                case -8:
                  goto switchD_00190e94_caseD_fffffff8;
                case -7:
                  goto switchD_00190e94_caseD_fffffff9;
                case -6:
                  goto switchD_00190e94_caseD_fffffffa;
                case -5:
                  goto switchD_00190e94_caseD_fffffffb;
                case -4:
                  goto switchD_00190e94_caseD_fffffffc;
                }
              }
            }
          }
          else if (iVar16 == 2) {
            fVar55 = -1.0;
            switch(iVar17) {
            case -0xc:
switchD_00190e94_caseD_fffffffc:
              fVar55 = fVar30;
              break;
            case -0xb:
switchD_00190e94_caseD_fffffffb:
              fVar55 = fVar31;
              break;
            case -10:
switchD_00190e94_caseD_fffffffa:
              fVar55 = fVar32;
              break;
            case -9:
switchD_00190e94_caseD_fffffff9:
              fVar55 = fVar33;
              break;
            case -8:
              goto switchD_00190e94_caseD_fffffff8;
            case -7:
switchD_00190e94_caseD_fffffff7:
              fVar55 = fVar34;
              break;
            case -6:
switchD_00190e94_caseD_fffffff6:
              fVar55 = fVar35;
              break;
            case -5:
switchD_00190e94_caseD_fffffff5:
              fVar55 = fVar36;
              break;
            case -4:
switchD_00190e94_caseD_fffffff4:
              fVar55 = fVar37;
            }
          }
          else {
            fVar55 = -1.0;
            if (iVar16 == 7) {
              fVar55 = -1.0;
              switch(iVar17) {
              case -0xc:
                goto switchD_00190ef4_caseD_fffffffc;
              case -0xb:
                goto switchD_00190ef4_caseD_fffffffb;
              case -10:
                goto switchD_00190ef4_caseD_fffffffa;
              case -9:
                goto switchD_00190ef4_caseD_fffffff9;
              case -8:
                goto switchD_00190e94_caseD_fffffff8;
              case -7:
                goto switchD_00190ef4_caseD_fffffff7;
              case -6:
                goto switchD_00190ef4_caseD_fffffff6;
              case -5:
                goto switchD_00190ef4_caseD_fffffff5;
              case -4:
                goto switchD_00190ef4_caseD_fffffff4;
              }
            }
          }
          local_9c = 0.0;
          local_a0 = 0.0;
          auVar25._0_4_ = (float)(iVar6 + iVar17);
          auVar25._4_12_ = auVar54._4_12_;
          auVar19 = vfmadd132ss_fma(auVar25,ZEXT416((uint)local_64),ZEXT416((uint)local_58._0_4_));
          auVar26._8_4_ = 0x3effffff;
          auVar26._0_8_ = 0x3effffff3effffff;
          auVar26._12_4_ = 0x3effffff;
          auVar24._8_4_ = 0x80000000;
          auVar24._0_8_ = 0x8000000080000000;
          auVar24._12_4_ = 0x80000000;
          auVar20 = vpternlogd_avx512vl(auVar26,auVar19,auVar24,0xf8);
          auVar19 = ZEXT416((uint)(auVar19._0_4_ + auVar20._0_4_));
          auVar19 = vroundss_avx(auVar19,auVar19,0xb);
          iVar4 = (int)auVar19._0_4_;
          col = iVar4 - scale;
          if ((((row < 1) || (col < 1)) || (iimage->height < row + iVar8)) ||
             (iVar7 = col + (int)local_90, iimage->width < iVar7)) {
            haarXY(iimage,row,col,scale,&local_9c,&local_a0);
            auVar19 = vinsertps_avx(ZEXT416((uint)local_a0),ZEXT416((uint)local_9c),0x10);
          }
          else {
            iVar9 = iimage->data_width;
            pfVar1 = iimage->data;
            iVar12 = iVar9 * (row + -1);
            iVar15 = iVar9 * ((int)auVar18._0_4_ + -1);
            iVar9 = iVar9 * (row + -1 + iVar8);
            auVar19 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar12 + -1 + iVar4] -
                                                    pfVar1[iVar9 + -1 + iVar4])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar9 + -1 + iVar7] -
                                                    pfVar1[iVar12 + -1 + col])));
            auVar20 = vfmadd213ss_fma(ZEXT416((uint)(pfVar1[iVar15 + -1 + col] -
                                                    pfVar1[iVar15 + -1 + iVar7])),
                                      SUB6416(ZEXT464(0x40000000),0),
                                      ZEXT416((uint)(pfVar1[iVar9 + -1 + iVar7] -
                                                    pfVar1[iVar12 + -1 + col])));
            auVar19 = vinsertps_avx(ZEXT416((uint)(auVar20._0_4_ -
                                                  (pfVar1[iVar9 + -1 + col] -
                                                  pfVar1[iVar12 + -1 + iVar7]))),
                                    ZEXT416((uint)((pfVar1[iVar9 + -1 + col] -
                                                   pfVar1[iVar12 + -1 + iVar7]) + auVar19._0_4_)),
                                    0x10);
          }
          fVar55 = fVar46 * fVar55;
          iVar17 = iVar17 + 1;
          auVar28._0_4_ = fVar55 * auVar19._0_4_;
          auVar28._4_4_ = fVar55 * auVar19._4_4_;
          auVar28._8_4_ = fVar55 * auVar19._8_4_;
          auVar28._12_4_ = fVar55 * auVar19._12_4_;
          auVar27._8_4_ = 0x7fffffff;
          auVar27._0_8_ = 0x7fffffff7fffffff;
          auVar27._12_4_ = 0x7fffffff;
          auVar19 = vandps_avx512vl(auVar28,auVar27);
          auVar19 = vmovlhps_avx(auVar28,auVar19);
          fVar55 = auVar50._0_4_ + auVar19._0_4_;
          fVar51 = auVar50._4_4_ + auVar19._4_4_;
          fVar52 = auVar50._8_4_ + auVar19._8_4_;
          fVar53 = auVar50._12_4_ + auVar19._12_4_;
          auVar50 = ZEXT1664(CONCAT412(fVar53,CONCAT48(fVar52,CONCAT44(fVar51,fVar55))));
        } while (iVar17 != -3);
        iVar11 = iVar11 + 1;
        uVar13 = (int)local_80 + 1;
        uVar14 = (ulong)uVar13;
      } while (uVar13 != 5);
      if (local_68 < 0x10) {
        local_48 = ZEXT416((uint)gauss_s2_arr[local_68]);
      }
      uVar10 = (ulong)((int)local_60 + 5);
      uVar13 = local_68 + 1;
      auVar47._0_4_ = fVar55 * (float)local_48._0_4_;
      auVar47._4_4_ = fVar51 * (float)local_48._0_4_;
      auVar47._8_4_ = fVar52 * (float)local_48._0_4_;
      auVar47._12_4_ = fVar53 * (float)local_48._0_4_;
      auVar49._0_4_ = auVar47._0_4_ * auVar47._0_4_;
      auVar49._4_4_ = auVar47._4_4_ * auVar47._4_4_;
      auVar49._8_4_ = auVar47._8_4_ * auVar47._8_4_;
      auVar49._12_4_ = auVar47._12_4_ * auVar47._12_4_;
      auVar19 = vshufpd_avx(auVar47,auVar47,1);
      *(undefined1 (*) [16])(local_88->descriptor + local_98) = auVar47;
      local_98 = local_98 + 4;
      auVar18 = vmovshdup_avx(auVar49);
      auVar18 = vfmadd231ss_fma(auVar18,auVar47,auVar47);
      auVar19 = vfmadd213ss_fma(auVar19,auVar19,auVar18);
      auVar18 = vshufps_avx(auVar47,auVar47,0xff);
      auVar18 = vfmadd213ss_fma(auVar18,auVar18,auVar19);
      fVar46 = local_74 + auVar18._0_4_;
    } while (uVar13 != local_a4);
    local_a4 = local_a4 + 4;
    uVar13 = local_6c + 4;
    iVar6 = iVar6 + 5;
    bVar2 = 2 < iVar16;
    iVar16 = iVar16 + 5;
    if (bVar2) {
      if (fVar46 < 0.0) {
        fVar46 = sqrtf(fVar46);
      }
      else {
        auVar18 = vsqrtss_avx(ZEXT416((uint)fVar46),ZEXT416((uint)fVar46));
        fVar46 = auVar18._0_4_;
      }
      lVar5 = 0;
      auVar54 = vbroadcastss_avx512f(ZEXT416((uint)(1.0 / fVar46)));
      do {
        auVar50 = vmulps_avx512f(auVar54,*(undefined1 (*) [64])(local_88->descriptor + lVar5));
        *(undefined1 (*) [64])(local_88->descriptor + lVar5) = auVar50;
        lVar5 = lVar5 + 0x10;
      } while (lVar5 != 0x40);
      return;
    }
  } while( true );
}

Assistant:

void get_msurf_descriptor_precompute_gauss_case(struct integral_image* iimage, struct interest_point* ipoint) {
    /*
    applied optimizations:
        - all of get_msurf_inlinedHaarWavelets
        - precompute gauss_s2 like get_msurf_descriptor_gauss_s2_precomputed 
          (changed to use case statements here)
        - precompute gauss_s1 by computing them once 
          with separable kernels and using case statements
    */

    float scale = ipoint->scale;
    // float scale_mul_25f = 2.5f*scale;
    int int_scale = (int) roundf(scale);
    // int int_scale_mul_2 =  2 * int_scale;
    float scale_squared = scale*scale;

    float g1_factor = -0.08f / (scale_squared); // since 0.08f / (scale*scale) == 1.0f / (2.0f * 2.5f * scale * 2.5f * scale)
    //float g2_factor = -1.0f / 4.5f; // since 1.0f / 4.5f == 1.0f / (2.0f * 1.5f * 1.5f)

    float ipoint_x = roundf(ipoint->x) + 0.5*scale;
    float ipoint_y = roundf(ipoint->y) + 0.5*scale;

    // build descriptor
    float* descriptor = ipoint->descriptor;
    int desc_idx = 0;
    float sum_of_squares = 0.0f;

    // Initializing gauss_s2 index for precomputed array
    int gauss_s2_index = 0;

    //r(2.5*s) + r(1.5*s) == -(r(2.5*s) - r(6.5*s))

    float s0  = roundf( 0.5 * scale);
    float s1  = roundf( 1.5 * scale);
    float s2  = roundf( 2.5 * scale);
    float s3  = roundf( 3.5 * scale);
    float s4  = roundf( 4.5 * scale);
    float s5  = roundf( 5.5 * scale);
    float s6  = roundf( 6.5 * scale);
    float s7  = roundf( 7.5 * scale);
    float s8  = roundf( 8.5 * scale);
    float s9  = roundf( 9.5 * scale);
    float s10 = roundf(10.5 * scale);
    float s11 = roundf(11.5 * scale);

    float e_c0_m4 = s2 + s1; // CAREFUL HERE!
    float e_c0_m3 = s2 + s0; // CAREFUL HERE!
    float e_c0_m2 = s2 - s0;
    float e_c0_m1 = s2 - s1;
    //float e_c0_z0 = s2 - s2;
    float e_c0_p1 = s2 - s3;
    float e_c0_p2 = s2 - s4;
    float e_c0_p3 = s2 - s5;
    float e_c0_p4 = s2 - s6;

    float e_c1_m4 = s7 - s3;
    float e_c1_m3 = s7 - s4;
    float e_c1_m2 = s7 - s5;
    float e_c1_m1 = s7 - s6;
    //float e_c1_z0 = s7 - s7;
    float e_c1_p1 = s7 - s8;
    float e_c1_p2 = s7 - s9;
    float e_c1_p3 = s7 - s10;
    float e_c1_p4 = s7 - s11;

    float gauss_s1_c0_m4 = expf(g1_factor * (e_c0_m4 * e_c0_m4));
    float gauss_s1_c0_m3 = expf(g1_factor * (e_c0_m3 * e_c0_m3));
    float gauss_s1_c0_m2 = expf(g1_factor * (e_c0_m2 * e_c0_m2));
    float gauss_s1_c0_m1 = expf(g1_factor * (e_c0_m1 * e_c0_m1));
    float gauss_s1_c0_z0 = 1.0f; //expf(g1_factor * (e_c0_z0 * e_c0_z0));
    float gauss_s1_c0_p1 = expf(g1_factor * (e_c0_p1 * e_c0_p1));
    float gauss_s1_c0_p2 = expf(g1_factor * (e_c0_p2 * e_c0_p2));
    float gauss_s1_c0_p3 = expf(g1_factor * (e_c0_p3 * e_c0_p3));
    float gauss_s1_c0_p4 = expf(g1_factor * (e_c0_p4 * e_c0_p4));

    float gauss_s1_c1_m4 = expf(g1_factor * (e_c1_m4 * e_c1_m4));
    float gauss_s1_c1_m3 = expf(g1_factor * (e_c1_m3 * e_c1_m3));
    float gauss_s1_c1_m2 = expf(g1_factor * (e_c1_m2 * e_c1_m2));
    float gauss_s1_c1_m1 = expf(g1_factor * (e_c1_m1 * e_c1_m1));
    float gauss_s1_c1_z0 = 1.0f; //expf(g1_factor * (e_c1_z0 * e_c1_z0));
    float gauss_s1_c1_p1 = expf(g1_factor * (e_c1_p1 * e_c1_p1));
    float gauss_s1_c1_p2 = expf(g1_factor * (e_c1_p2 * e_c1_p2));
    float gauss_s1_c1_p3 = expf(g1_factor * (e_c1_p3 * e_c1_p3));
    float gauss_s1_c1_p4 = expf(g1_factor * (e_c1_p4 * e_c1_p4));

    // calculate descriptor for this interest point
    for (int i=-8; i<8; i+=5) {

        for (int j=-8; j<8; j+=5) {

            float dx = 0.0f;
            float dy = 0.0f; 
            float mdx = 0.0f; 
            float mdy = 0.0f;

            //int xs = (int) roundf(ipoint_x + (i+0.5f) * scale);
            //int ys = (int) roundf(ipoint_y + (j+0.5f) * scale);

            int gauss_index_l = -4;
            for (int l = j-4; l < j + 5; ++l, ++gauss_index_l) {

                //Get y coords of sample point
                int sample_y = (int) roundf(ipoint_y + l * scale);
                //float ys_sub_sample_y = (float) ys-sample_y;
                //float ys_sub_sample_y_squared = ys_sub_sample_y*ys_sub_sample_y;

                //Get y coords of sample point
                int sample_y_sub_int_scale = sample_y-int_scale;

                float gauss_s1_y = -1;
                if (j == -8) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_m4; break;
                    };
                } else if (j == -3) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_p4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_p3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_p2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_p1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_m1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_m2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_m3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_m4; break;
                    };
                } else if (j == 2) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c0_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c0_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c0_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c0_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c0_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c0_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c0_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c0_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c0_p4; break;
                    };
                } else if (j == 7) {
                    switch (gauss_index_l) {
                        case -4: gauss_s1_y = gauss_s1_c1_m4; break;
                        case -3: gauss_s1_y = gauss_s1_c1_m3; break;
                        case -2: gauss_s1_y = gauss_s1_c1_m2; break;
                        case -1: gauss_s1_y = gauss_s1_c1_m1; break;
                        case 0:  gauss_s1_y = gauss_s1_c1_z0; break;
                        case 1:  gauss_s1_y = gauss_s1_c1_p1; break;
                        case 2:  gauss_s1_y = gauss_s1_c1_p2; break;
                        case 3:  gauss_s1_y = gauss_s1_c1_p3; break;
                        case 4:  gauss_s1_y = gauss_s1_c1_p4; break;
                    };
                }

                int gauss_index_k = -4;
                for (int k = i-4; k < i + 5; ++k, ++gauss_index_k) {
                
                    //Get x coords of sample point
                    int sample_x = (int) roundf(ipoint_x + k * scale);
                    //float xs_sub_sample_x = (float) xs-sample_x;
                    //float xs_sub_sample_x_squared = xs_sub_sample_x*xs_sub_sample_x;

                    //Get x coords of sample point
                    int sample_x_sub_int_scale = sample_x-int_scale;

                    float gauss_s1_x = -1;
                    if (i == -8) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_m4; break;
                        };
                    } else if (i == -3) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_p4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_p3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_p2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_p1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_m1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_m2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_m3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_m4; break;
                        };
                    } else if (i == 2) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c0_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c0_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c0_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c0_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c0_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c0_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c0_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c0_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c0_p4; break;
                        };
                    } else if (i == 7) {
                        switch (gauss_index_k) {
                            case -4: gauss_s1_x = gauss_s1_c1_m4; break;
                            case -3: gauss_s1_x = gauss_s1_c1_m3; break;
                            case -2: gauss_s1_x = gauss_s1_c1_m2; break;
                            case -1: gauss_s1_x = gauss_s1_c1_m1; break;
                            case 0:  gauss_s1_x = gauss_s1_c1_z0; break;
                            case 1:  gauss_s1_x = gauss_s1_c1_p1; break;
                            case 2:  gauss_s1_x = gauss_s1_c1_p2; break;
                            case 3:  gauss_s1_x = gauss_s1_c1_p3; break;
                            case 4:  gauss_s1_x = gauss_s1_c1_p4; break;
                        };
                    }

/*
                    //Get the gaussian weighted x and y responses
                    float gauss_s1_x_real = expf(g1_factor * (xs_sub_sample_x_squared));
                    float gauss_s1_y_real = expf(g1_factor * (ys_sub_sample_y_squared));

                    if (gauss_s1_x != gauss_s1_x_real || gauss_s1_y != gauss_s1_y_real) {
                        std::cout << "gauss_s1_x: " << gauss_s1_x << std::endl;
                        std::cout << "gauss_s1_y: " << gauss_s1_y << std::endl;
                        std::cout << "gauss_s1_x_real: " << gauss_s1_x_real << std::endl;
                        std::cout << "gauss_s1_y_real: " << gauss_s1_y_real << std::endl;
                    }
*/

                    float gauss_s1 = gauss_s1_x * gauss_s1_y;

                    float rx = 0.0f;
                    float ry = 0.0f;
                    haarXY_precheck_boundaries(iimage, sample_y_sub_int_scale, sample_x_sub_int_scale, int_scale, &rx, &ry);
                    
                    //Get the gaussian weighted x and y responses on rotated axis
                    float rrx = gauss_s1 * ry;
                    float rry = gauss_s1 * rx;

                    dx += rrx;
                    dy += rry;
                    mdx += fabsf(rrx);
                    mdy += fabsf(rry);
                }
            }

            //float gauss_s2 = expf(g2_factor * (cx_squared + cy_squared)); 
            // Precomputed 4x4 gauss_s2 with (x,y) = {-1.5, -0.5, 0.5, 1.5}^2 and sig = 1.5f
            //float gauss_s2 = gauss_s2_precomputed[gauss_s2_index++];
            float gauss_s2;
            switch (gauss_s2_index) {
                case 0:  gauss_s2 = 0.026022f; break;
                case 1:  gauss_s2 = 0.040585f; break;
                case 2:  gauss_s2 = 0.040585f; break;
                case 3:  gauss_s2 = 0.026022f; break;
                case 4:  gauss_s2 = 0.040585f; break;
                case 5:  gauss_s2 = 0.063297f; break;
                case 6:  gauss_s2 = 0.063297f; break;
                case 7:  gauss_s2 = 0.040585f; break;
                case 8:  gauss_s2 = 0.040585f; break;
                case 9:  gauss_s2 = 0.063297f; break;
                case 10: gauss_s2 = 0.063297f; break;
                case 11: gauss_s2 = 0.040585f; break;
                case 12: gauss_s2 = 0.026022f; break;
                case 13: gauss_s2 = 0.040585f; break;
                case 14: gauss_s2 = 0.040585f; break;
                case 15: gauss_s2 = 0.026022f; break;
            };
            gauss_s2_index++;

            // add the values to the descriptor vector
            float d1 = dx * gauss_s2;
            float d2 = dy * gauss_s2;
            float d3 = mdx * gauss_s2;
            float d4 = mdy * gauss_s2;

            descriptor[desc_idx] = d1;
            descriptor[desc_idx+1] = d2;
            descriptor[desc_idx+2] = d3;
            descriptor[desc_idx+3] = d4;

            // precompute for normaliztion
            sum_of_squares += (d1*d1 + d2*d2 + d3*d3 + d4*d4);

            desc_idx += 4;

        }
    }

    // rescale to unit vector
    // NOTE: using sqrtf() for floats
    float norm_factor = 1.0f / sqrtf(sum_of_squares);

    for (int i = 0; i < 64; ++i) {
        descriptor[i] *= norm_factor;
    }
}